

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeLinear>::ComputeVecandShape(TPZShapeData *data)

{
  pair<int,_long> *ppVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  MElementType MVar9;
  int *piVar10;
  ostream *this;
  long *plVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int maxorder [3];
  int scalarorder;
  TPZManVector<int,_3> VectorSides;
  TPZManVector<int,_3> directions;
  TPZManVector<int,_3> bilinear;
  TPZManVector<int,_3> normalsides;
  TPZGenMatrix<int> shapeorders;
  TPZManVector<long,_27> FirstIndex;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_81> vecpermute;
  int local_434 [3];
  TPZVec<int> *local_428;
  ulong local_420;
  ulong local_418;
  long local_410;
  long local_408;
  int local_400;
  int local_3fc;
  TPZVec<int> local_3f8;
  int local_3d8 [4];
  TPZVec<int> local_3c8;
  int local_3a8 [4];
  undefined **local_398;
  undefined **local_390;
  int64_t local_388;
  TPZVec<int> local_380;
  int local_360 [4];
  TPZVec<int> local_350;
  int local_330 [4];
  TPZManVector<int,_10> local_320;
  TPZManVector<int,_27> local_2d8;
  TPZManVector<int,_10> local_1e0;
  TPZVec<int> local_198;
  int local_178 [82];
  
  TPZVec<int>::TPZVec(&local_3f8,0);
  local_3f8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_3f8.fStore = local_3d8;
  local_3f8.fNElements = 3;
  local_3f8.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_380,0);
  local_380.fStore = local_360;
  local_380._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_380.fNElements = 3;
  local_380.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_3c8,0);
  local_3c8.fStore = local_3a8;
  local_3c8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_3c8.fNElements = 3;
  local_3c8.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_350,0);
  local_350.fStore = local_330;
  local_350._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_350.fNElements = 3;
  local_350.fNAlloc = 0;
  pztopology::TPZLine::GetSideHDivDirections(&local_3f8,&local_3c8,&local_380,&local_350);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  local_400 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[2];
  iVar7 = pzshape::TPZShapeLinear::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  local_198._vptr_TPZVec = (_func_int **)CONCAT44(local_198._vptr_TPZVec._4_4_,2);
  TPZManVector<int,_10>::TPZManVector(&local_1e0,local_3f8.fNElements,(int *)&local_198);
  uVar17 = 0;
  local_428 = &(data->fH1ConnectOrders).super_TPZVec<int>;
  TPZVec<int>::TPZVec(&local_198,0);
  local_198.fStore = local_178;
  local_390 = &PTR__TPZManVector_018e4fb0;
  local_198._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_198.fNElements = 3;
  local_198.fNAlloc = 0;
  iVar18 = 0;
  do {
    iVar8 = pztopology::TPZLine::SideDimension(iVar18);
    if (iVar8 == 0) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_320);
      pztopology::TPZLine::LowerDimensionSides(iVar18,(TPZStack<int,_10> *)&local_320);
      uVar6 = (uint)local_320.super_TPZVec<int>.fNElements;
      uVar15 = (uint)local_320.super_TPZVec<int>.fNElements + 1;
      TPZManVector<int,_27>::TPZManVector(&local_2d8,(long)(int)uVar15);
      HDivPermutation(iVar18,data,&local_2d8.super_TPZVec<int>);
      if (uVar6 < 0x7fffffff) {
        uVar16 = 0;
        do {
          local_198.fStore[(long)(int)uVar17 + uVar16] =
               local_2d8.super_TPZVec<int>.fStore[uVar16] + uVar17;
          local_1e0.super_TPZVec<int>.fStore[(long)(int)uVar17 + uVar16] = iVar18;
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
        uVar17 = uVar17 + (int)uVar16;
      }
      if (local_2d8.super_TPZVec<int>.fStore == local_2d8.fExtAlloc) {
        local_2d8.super_TPZVec<int>.fStore = (int *)0x0;
      }
      local_2d8.super_TPZVec<int>.fNAlloc = 0;
      local_2d8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_2d8.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_2d8.super_TPZVec<int>.fStore);
      }
      TPZManVector<int,_10>::~TPZManVector(&local_320);
    }
    auVar5 = _DAT_014f8350;
    auVar4 = _DAT_014f8340;
    iVar18 = iVar18 + 1;
  } while (iVar18 != 3);
  lVar19 = (long)(int)uVar17;
  lVar13 = local_198.fNElements - lVar19;
  if (lVar13 != 0 && lVar19 <= local_198.fNElements) {
    lVar14 = lVar13 + -1;
    auVar22._8_4_ = (int)lVar14;
    auVar22._0_8_ = lVar14;
    auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar16 = 0;
    auVar22 = auVar22 ^ _DAT_014f8350;
    uVar15 = uVar17;
    do {
      auVar23._8_4_ = (int)uVar16;
      auVar23._0_8_ = uVar16;
      auVar23._12_4_ = (int)(uVar16 >> 0x20);
      auVar23 = (auVar23 | auVar4) ^ auVar5;
      if ((bool)(~(auVar23._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar23._0_4_ ||
                  auVar22._4_4_ < auVar23._4_4_) & 1)) {
        local_198.fStore[lVar19 + uVar16] = uVar15;
      }
      if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
          auVar23._12_4_ <= auVar22._12_4_) {
        local_198.fStore[lVar19 + uVar16 + 1] = uVar15 + 1;
      }
      uVar16 = uVar16 + 2;
      uVar15 = uVar15 + 2;
    } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar16);
  }
  TPZGenMatrix<int>::TPZGenMatrix((TPZGenMatrix<int> *)&local_320,(long)iVar7,3);
  pzshape::TPZShapeLinear::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,local_428,(TPZGenMatrix<int> *)&local_320);
  local_3fc = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[2] + 1;
  TPZVec<long>::TPZVec((TPZVec<long> *)&local_2d8,0);
  local_398 = &PTR__TPZManVector_018e5008;
  local_2d8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5008;
  local_2d8.super_TPZVec<int>.fStore = local_2d8.fExtAlloc;
  local_2d8.super_TPZVec<int>.fNElements = 4;
  local_2d8.super_TPZVec<int>.fNAlloc = 0;
  FirstShapeIndex((TPZVec<long> *)&local_2d8,&local_3fc);
  local_388 = local_3f8.fNElements;
  if ((int)uVar17 < 1) {
    iVar7 = 0;
  }
  else {
    local_420 = (ulong)uVar17;
    uVar16 = 0;
    iVar7 = 0;
    local_408 = lVar19;
    do {
      local_410 = (long)local_198.fStore[uVar16];
      local_428 = (TPZVec<int> *)(long)local_3f8.fStore[local_410];
      iVar18 = local_2d8.super_TPZVec<int>.fStore[(long)((long)&local_428->_vptr_TPZVec + 1) * 2];
      local_418 = uVar16;
      if ((int)*(undefined8 *)(local_2d8.super_TPZVec<int>.fStore + (long)local_428 * 2) < iVar18) {
        iVar8 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
                [local_1e0.super_TPZVec<int>.fStore[uVar16]];
        lVar13 = (long)(int)*(undefined8 *)
                             (local_2d8.super_TPZVec<int>.fStore + (long)local_428 * 2);
        do {
          uVar15 = pztopology::TPZLine::SideDimension((int)local_428);
          if ((int)uVar15 < 1) {
LAB_0100d34a:
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_410;
            ppVar1[iVar7].second = lVar13;
            iVar7 = iVar7 + 1;
          }
          else {
            bVar3 = true;
            uVar16 = 0;
            do {
              piVar10 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_320,lVar13,uVar16)
              ;
              if (iVar8 < *piVar10) {
                bVar3 = false;
              }
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
            lVar19 = local_408;
            if (bVar3) goto LAB_0100d34a;
          }
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != iVar18);
      }
      uVar16 = local_418 + 1;
    } while (uVar16 != local_420);
  }
  if ((int)uVar17 < local_388) {
    do {
      local_410 = (long)local_198.fStore[lVar19];
      iVar18 = local_3f8.fStore[local_410];
      local_428 = (TPZVec<int> *)CONCAT44(local_428._4_4_,local_380.fStore[local_410]);
      local_418 = (ulong)local_3c8.fStore[local_410];
      MVar9 = pztopology::TPZLine::Type(iVar18);
      iVar8 = local_2d8.super_TPZVec<int>.fStore[((long)iVar18 + 1) * 2];
      if ((int)*(undefined8 *)(local_2d8.super_TPZVec<int>.fStore + (long)iVar18 * 2) < iVar8) {
        lVar13 = (long)(int)*(undefined8 *)(local_2d8.super_TPZVec<int>.fStore + (long)iVar18 * 2);
        local_420 = CONCAT44(local_420._4_4_,iVar18);
        local_408 = lVar19;
        do {
          uVar17 = pztopology::TPZLine::SideDimension(iVar18);
          local_434[0] = local_400;
          local_434[1] = local_400;
          local_434[2] = local_400;
          if ((int)local_428 != 0) {
            local_434[local_418] = local_434[local_418] + 1;
          }
          if ((int)uVar17 < 1) {
LAB_0100d534:
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_410;
            ppVar1[iVar7].second = lVar13;
            iVar7 = iVar7 + 1;
          }
          else {
            bVar3 = true;
            uVar16 = 0;
            do {
              switch(MVar9) {
              case EOned:
                piVar10 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_320,lVar13,0);
                break;
              case ETriangle:
              case ETetraedro:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar13,uVar16);
                iVar12 = local_434[uVar16] + 1;
                iVar18 = *piVar10;
                bVar21 = SBORROW4(iVar18,iVar12);
                iVar2 = iVar18 - iVar12;
                bVar20 = iVar18 == iVar12;
                goto LAB_0100d511;
              case EQuadrilateral:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar13,uVar16);
                break;
              case EPiramide:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar13,uVar16);
                break;
              case EPrisma:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar13,uVar16);
                break;
              case ECube:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_320,lVar13,uVar16);
                break;
              default:
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                           ,0x104);
              }
              iVar12 = *piVar10;
              iVar18 = local_434[uVar16];
              bVar21 = SBORROW4(iVar12,iVar18);
              iVar2 = iVar12 - iVar18;
              bVar20 = iVar12 == iVar18;
LAB_0100d511:
              if (!bVar20 && bVar21 == iVar2 < 0) {
                bVar3 = false;
              }
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
            lVar19 = local_408;
            iVar18 = (int)local_420;
            if (bVar3) goto LAB_0100d534;
          }
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != iVar8);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_388);
  }
  iVar18 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
  if (iVar7 == iVar18) {
    if (local_2d8.super_TPZVec<int>.fStore == local_2d8.fExtAlloc) {
      local_2d8.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_2d8.super_TPZVec<int>.fNAlloc = 0;
    local_2d8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_2d8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_2d8.super_TPZVec<int>.fStore);
    }
    TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)&local_320);
    if (local_198.fStore == local_178) {
      local_198.fStore = (int *)0x0;
    }
    local_198.fNAlloc = 0;
    local_198._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_198.fStore != (int *)0x0) {
      operator_delete__(local_198.fStore);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_1e0);
    if (local_350.fStore == local_330) {
      local_350.fStore = (int *)0x0;
    }
    local_350.fNAlloc = 0;
    local_350._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_350.fStore != (int *)0x0) {
      operator_delete__(local_350.fStore);
    }
    if (local_3c8.fStore == local_3a8) {
      local_3c8.fStore = (int *)0x0;
    }
    local_3c8.fNAlloc = 0;
    local_3c8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_3c8.fStore != (int *)0x0) {
      operator_delete__(local_3c8.fStore);
    }
    if (local_380.fStore == local_360) {
      local_380.fStore = (int *)0x0;
    }
    local_380.fNAlloc = 0;
    local_380._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_380.fStore != (int *)0x0) {
      operator_delete__(local_380.fStore);
    }
    if (local_3f8.fStore == local_3d8) {
      local_3f8.fStore = (int *)0x0;
    }
    local_3f8.fNAlloc = 0;
    local_3f8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_3f8.fStore != (int *)0x0) {
      operator_delete__(local_3f8.fStore);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count ",6);
  this = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\nivs ",5);
  plVar11 = (long *)std::ostream::operator<<(this,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x113);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}